

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

void __thiscall
Parser::PushFuncBlockScope
          (Parser *this,ParseNodeBlock *pnodeBlock,ParseNodePtr **ppnodeScopeSave,
          ParseNodePtr **ppnodeExprScopeSave)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodePtr *ppPVar4;
  
  ppPVar4 = &pnodeBlock->pnodeNext;
  pnodeBlock->pnodeScopes = (ParseNodePtr)0x0;
  pnodeBlock->pnodeNext = (ParseNodePtr)0x0;
  if (this->m_ppnodeExprScope == (ParseNodePtr *)0x0) {
    if (this->m_ppnodeScope == (ParseNodePtr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x66f,"(m_ppnodeScope)","m_ppnodeScope");
      if (!bVar2) goto LAB_00e7ece4;
      *puVar3 = 0;
    }
    if (*this->m_ppnodeScope != (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x670,"(*m_ppnodeScope == nullptr)","*m_ppnodeScope == nullptr");
      if (!bVar2) goto LAB_00e7ece4;
      *puVar3 = 0;
    }
    *this->m_ppnodeScope = (ParseNodePtr)pnodeBlock;
    *ppnodeScopeSave = ppPVar4;
    ppPVar4 = this->m_ppnodeExprScope;
  }
  else {
    *ppnodeScopeSave = this->m_ppnodeScope;
    if (*this->m_ppnodeExprScope != (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x669,"(*m_ppnodeExprScope == nullptr)","*m_ppnodeExprScope == nullptr");
      if (!bVar2) {
LAB_00e7ece4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    *this->m_ppnodeExprScope = (ParseNodePtr)pnodeBlock;
  }
  *ppnodeExprScopeSave = ppPVar4;
  this->m_ppnodeScope = &pnodeBlock->pnodeScopes;
  this->m_ppnodeExprScope = (ParseNodePtr *)0x0;
  return;
}

Assistant:

void Parser::PushFuncBlockScope(ParseNodeBlock * pnodeBlock, ParseNodePtr **ppnodeScopeSave, ParseNodePtr **ppnodeExprScopeSave)
{
    // Maintain the scope tree.

    pnodeBlock->pnodeScopes = nullptr;
    pnodeBlock->pnodeNext = nullptr;

    // Insert this block into the active list of scopes (m_ppnodeExprScope or m_ppnodeScope).
    // Save the current block's "next" pointer as the new endpoint of that list.
    if (m_ppnodeExprScope)
    {
        *ppnodeScopeSave = m_ppnodeScope;

        Assert(*m_ppnodeExprScope == nullptr);
        *m_ppnodeExprScope = pnodeBlock;
        *ppnodeExprScopeSave = &pnodeBlock->pnodeNext;
    }
    else
    {
        Assert(m_ppnodeScope);
        Assert(*m_ppnodeScope == nullptr);
        *m_ppnodeScope = pnodeBlock;
        *ppnodeScopeSave = &pnodeBlock->pnodeNext;

        *ppnodeExprScopeSave = m_ppnodeExprScope;
    }

    // Advance the global scope list pointer to the new block's child list.
    m_ppnodeScope = &pnodeBlock->pnodeScopes;
    // Set m_ppnodeExprScope to NULL to make that list inactive.
    m_ppnodeExprScope = nullptr;
}